

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O0

int __thiscall sqlite::Connection::Stmt::bind_parameter_index(Stmt *this,string *name)

{
  int iVar1;
  undefined8 uVar2;
  sqlite3 *db;
  char *pcVar3;
  string *in_RDI;
  int index;
  char *in_stack_ffffffffffffff20;
  allocator *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  string *what;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 uVar5;
  allocator in_stack_ffffffffffffff57;
  string local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  
  what = *(string **)in_RDI;
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = sqlite3_bind_parameter_index(what,uVar2);
  if (iVar1 == 0) {
    uVar5 = 1;
    uVar2 = __cxa_allocate_exception(0x48);
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    db = (sqlite3 *)sqlite3_errmsg(*(undefined8 *)(in_RDI + 8));
    std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    pcVar3 = (char *)sqlite3_sql(*(undefined8 *)in_RDI);
    paVar4 = (allocator *)&stack0xffffffffffffff57;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,pcVar3,paVar4);
    Logic_error::Logic_error
              ((Logic_error *)
               CONCAT17(in_stack_ffffffffffffff57,CONCAT16(uVar5,in_stack_ffffffffffffff50)),what,
               in_RDI,(int)((ulong)uVar2 >> 0x20),db);
    __cxa_throw(uVar2,&Logic_error::typeinfo,Logic_error::~Logic_error);
  }
  return iVar1;
}

Assistant:

int Connection::Stmt::bind_parameter_index(const std::string & name)
    {
        int index = sqlite3_bind_parameter_index(stmt_, name.c_str());
        if(!index)
        {
            throw Logic_error("Error looking up index for bind var " +
                name + ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), SQLITE_ERROR, db_);
        }
        return index;
    }